

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration(void)

{
  long lVar1;
  QSslConfigurationPrivate *pQVar2;
  QSslConfigurationPrivate *pQVar3;
  Type *pTVar4;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  QSharedDataPointer<QSslConfigurationPrivate> this;
  
  this.d.ptr = in_RDI.d.ptr;
  QSslSocketPrivate::ensureInitialized();
  pQVar3 = (QSslConfigurationPrivate *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)this.d.ptr);
  if (pQVar3 != (QSslConfigurationPrivate *)0x0) {
    if (*(long *)pQVar3 == 0) {
      LOCK();
      lVar1 = *(long *)pQVar3;
      if (lVar1 == 0) {
        *(undefined8 *)pQVar3 = 1;
      }
      UNLOCK();
      if (lVar1 == 0) goto LAB_0016ebdf;
    }
    this.d.ptr = (totally_ordered_wrapper<QSslConfigurationPrivate_*>)
                 (totally_ordered_wrapper<QSslConfigurationPrivate_*>)pQVar3;
    QBasicMutex::lockInternal();
  }
LAB_0016ebdf:
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)this.d.ptr);
  pQVar2 = (pTVar4->dtlsConfig).d.ptr;
  *(QSslConfigurationPrivate **)in_RDI.d.ptr = pQVar2;
  if (pQVar2 != (QSslConfigurationPrivate *)0x0) {
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  if (pQVar3 != (QSslConfigurationPrivate *)0x0) {
    LOCK();
    lVar1 = *(long *)pQVar3;
    *(undefined8 *)pQVar3 = 0;
    UNLOCK();
    if (lVar1 != 1) {
      QBasicMutex::unlockInternalFutex(pQVar3);
    }
  }
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
}

Assistant:

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);

    return QSslConfiguration(globalData()->dtlsConfig.data());
}